

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m2v_LU_invmult(m2v *LU,int rank,int *rowperm,int *colperm,m2v *Y,m2v *X_out)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  m2v_base *pmVar6;
  m2v_base *pmVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  
  if (rank == -1) {
    rank = LU->n_row;
    if (LU->n_col < LU->n_row) {
      rank = LU->n_col;
    }
  }
  if (rank < X_out->n_row) {
    lVar10 = (long)rank;
    do {
      iVar2 = X_out->row_stride;
      if (0 < (long)iVar2) {
        iVar3 = colperm[lVar10];
        pmVar6 = X_out->e;
        lVar15 = 0;
        do {
          pmVar6[(long)iVar3 * (long)iVar2 + lVar15] = 0;
          lVar15 = lVar15 + 1;
        } while (lVar15 < X_out->row_stride);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < X_out->n_row);
  }
  if (0 < rank) {
    uVar13 = 0;
    do {
      iVar2 = X_out->row_stride;
      if (0 < (long)iVar2) {
        iVar3 = colperm[uVar13];
        iVar4 = rowperm[uVar13];
        iVar5 = Y->row_stride;
        pmVar6 = Y->e;
        pmVar7 = X_out->e;
        lVar10 = 0;
        do {
          pmVar7[(long)iVar3 * (long)iVar2 + lVar10] = pmVar6[(long)iVar5 * (long)iVar4 + lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 < X_out->row_stride);
      }
      if (uVar13 != 0) {
        pmVar6 = LU->e;
        uVar11 = 0;
        do {
          if (((pmVar6[(int)(((uint)(uVar11 >> 5) & 0x7ffffff) + LU->row_stride * (int)uVar13)] >>
                ((uint)uVar11 & 0x1f) & 1) != 0) && (lVar10 = (long)X_out->row_stride, 0 < lVar10))
          {
            iVar2 = colperm[uVar11];
            iVar3 = colperm[uVar13];
            pmVar7 = X_out->e;
            lVar15 = 0;
            do {
              puVar1 = pmVar7 + iVar3 * lVar10 + lVar15;
              *puVar1 = *puVar1 ^ pmVar7[iVar2 * lVar10 + lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 < X_out->row_stride);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar13);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)rank);
  }
  uVar13 = (ulong)(uint)rank;
  if (0 < rank) {
    do {
      uVar11 = uVar13 - 1;
      if ((long)uVar13 < (long)LU->n_col) {
        pmVar6 = LU->e;
        uVar12 = uVar13;
        do {
          uVar9 = (uint)uVar12;
          uVar14 = uVar9 + 0x1f;
          if (-1 < (int)uVar9) {
            uVar14 = uVar9;
          }
          if (((pmVar6[((int)uVar14 >> 5) + LU->row_stride * (int)uVar11] >> (uVar9 & 0x1f) & 1) !=
               0) && (lVar10 = (long)X_out->row_stride, 0 < lVar10)) {
            iVar2 = colperm[uVar12];
            iVar3 = colperm[uVar11];
            pmVar7 = X_out->e;
            lVar15 = 0;
            do {
              puVar1 = pmVar7 + iVar3 * lVar10 + lVar15;
              *puVar1 = *puVar1 ^ pmVar7[iVar2 * lVar10 + lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 < X_out->row_stride);
          }
          uVar12 = uVar12 + 1;
        } while ((int)uVar12 < LU->n_col);
      }
      bVar8 = 1 < (long)uVar13;
      uVar13 = uVar11;
    } while (bVar8);
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_invmult)(const MV_GEN_TYPE* LU,
			int rank,
			const int* rowperm,
			const int* colperm,
			const MV_GEN_TYPE* Y,
			MV_GEN_TYPE* X_out)
{
	/* Check dimensions */
	assert(LU->n_col == X_out->n_row);
	assert(LU->n_row == Y->n_row);
	assert(X_out->n_col == Y->n_col);

	/* If the rank is unspecified (-1), we assume the max rank */
	if (rank == -1)
		rank = (LU->n_col < LU->n_row ? LU->n_col : LU->n_row);

	/* Clear out the unused rows in the target vector */
	for (int i = rank; i < X_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(X_out, colperm[i]);
	}

	/* Multiply with L^-1 */
	for (int i = 0; i < rank; ++i) {
		MV_GEN_N(_copy_row)(Y, rowperm[i], X_out, colperm[i]);
		for (int j = 0; j < i; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
					MV_GEN_N(_get_el)(LU, i, j),
					X_out, colperm[i]);
		}
	}

	/* Multiply with U^-1 */
	for (int i = rank - 1; i >= 0; --i) {
		for (int j = i + 1; j < LU->n_col; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
			  MV_GEN_N(_get_el)(LU, i, j), X_out, colperm[i]);
		}
		MV_GEN_N(_mult_row)(X_out, colperm[i],
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}